

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O1

nhr_request nhr_request_create(void)

{
  nhr_request pnVar1;
  nhr_mutex pvVar2;
  
  pnVar1 = (nhr_request)nhr_malloc_zero(0xa8);
  signal(0xd,nhr_request_handle_sigpipe);
  pnVar1->socket = -1;
  pnVar1->command = 0;
  pvVar2 = nhr_mutex_create_recursive();
  pnVar1->work_mutex = pvVar2;
  pvVar2 = nhr_mutex_create_recursive();
  pnVar1->command_mutex = pvVar2;
  pnVar1->timeout = 0x1e;
  return pnVar1;
}

Assistant:

nhr_request nhr_request_create(void) {
	struct nhr_request_struct * r = (struct nhr_request_struct *)nhr_malloc_zero(sizeof(struct nhr_request_struct));

#if !defined(NHR_OS_WINDOWS)
	signal(SIGPIPE, nhr_request_handle_sigpipe);
#endif

	r->socket = NHR_INVALID_SOCKET;
	r->command = NHR_COMMAND_NONE;
	r->work_mutex = nhr_mutex_create_recursive();
	r->command_mutex = nhr_mutex_create_recursive();
	r->timeout = 30;

	return r;
}